

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O3

void M3x3_ExtractEulerAngles_XZX(double (*matrix) [3],double *angles)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = (*matrix)[0];
  if ((dVar4 != 9999999.0) || (NAN(dVar4))) {
    dVar2 = dVar4;
    if (dVar4 <= -dVar4) {
      dVar2 = -dVar4;
    }
    if (dVar2 <= 0.9999) {
      dVar4 = acos(dVar4);
      dVar2 = atan2(matrix[2][0],matrix[1][0]);
      dVar1 = atan2((*matrix)[2],-(*matrix)[1]);
      dVar4 = dVar4 * 57.29577951308232;
    }
    else {
      dVar1 = atan2(matrix[2][1],matrix[2][2]);
      dVar2 = 0.0;
      dVar4 = 0.0;
    }
    dVar3 = dVar2 * 57.29577951308232;
    *angles = dVar3;
    angles[1] = dVar4;
    dVar4 = (dVar1 + dVar2) * 57.29577951308232;
    dVar4 = (double)(~-(ulong)(180.0 < dVar4) & (ulong)dVar4 |
                    (ulong)(dVar4 + -360.0) & -(ulong)(180.0 < dVar4));
    angles[2] = (double)(~-(ulong)(dVar4 < -180.0) & (ulong)dVar4 |
                        (ulong)(dVar4 + 360.0) & -(ulong)(dVar4 < -180.0));
    dVar4 = (double)(~-(ulong)(180.0 < dVar3) & (ulong)dVar3 |
                    (ulong)(dVar3 + -360.0) & -(ulong)(180.0 < dVar3));
    if ((180.0 < dVar3) || (dVar4 < -180.0)) {
      *angles = (double)(~-(ulong)(dVar4 < -180.0) & (ulong)dVar4 |
                        (ulong)(dVar4 + 360.0) & -(ulong)(dVar4 < -180.0));
    }
  }
  else {
    *angles = 9999999.0;
    angles[1] = 9999999.0;
    angles[2] = 9999999.0;
  }
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_XZX(
  const double matrix[3][3],
  double angles[3])
{
    double ax1,az,ax2;

/*
   R[XZX] = Rx1 * Rz * Rx2

            | 1     0     0 |   | cz   -sz   0 |   | 1     0     0 |
          = | 0   cx1  -sx1 | * | sz    cz   0 | * | 0   cx2  -sx2 |
            | 0   sx1   cx1 |   |  0     0   1 |   | 0   sx2   cx2 |

            |    cz                -szcx2                 szsx2 |
          = | cx1sz    -sx1sx2 + cx1czcx2    -sx1cx2 - cx1czsx2 |
            | sx1sz     cx1sx2 + sx1czcx2     cx1cx2 - sx1czsx2 |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    if (ABS(matrix[0][0]) > 0.9999)
    {
        az = 0.0;
        ax1 = 0.0; // The ay1 rotation is only to accomplish the ax rotation.
        ax2 = atan2(matrix[2][1], matrix[2][2]);
    }
    else
    {
        az = acos(matrix[0][0]); // 0 <= az <= 180 by definition
        ax1 = atan2(matrix[2][0], matrix[1][0]);
        ax2 = atan2(matrix[0][2],-matrix[0][1]);
    }

    angles[0] = ax1 * (180.0/M_PI);
    angles[1] = az * (180.0/M_PI);
    angles[2] = (ax2+ax1) * (180.0/M_PI);
    //angles[2] = ax2 * (180.0/M_PI);

    if (angles[2] > +180.0) angles[2] -= 360.0;
    if (angles[2] < -180.0) angles[2] += 360.0;

    if (angles[0] > +180.0) angles[0] -= 360.0;
    if (angles[0] < -180.0) angles[0] += 360.0;
}